

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFEFStreamObjectHelper.cc
# Opt level: O2

size_t __thiscall QPDFEFStreamObjectHelper::getSize(QPDFEFStreamObjectHelper *this)

{
  bool bVar1;
  uint uVar2;
  size_t sVar3;
  QPDFObjectHandle val;
  allocator<char> local_39;
  QPDFObjectHandle local_38;
  string local_28 [32];
  
  std::__cxx11::string::string<std::allocator<char>>(local_28,"/Size",&local_39);
  getParam((QPDFEFStreamObjectHelper *)&local_38,(string *)this);
  std::__cxx11::string::~string(local_28);
  bVar1 = QPDFObjectHandle::isInteger(&local_38);
  if (bVar1) {
    uVar2 = QPDFObjectHandle::getUIntValueAsUInt(&local_38);
    sVar3 = (size_t)uVar2;
  }
  else {
    sVar3 = 0;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_38.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return sVar3;
}

Assistant:

size_t
QPDFEFStreamObjectHelper::getSize()
{
    auto val = getParam("/Size");
    if (val.isInteger()) {
        return QIntC::to_size(val.getUIntValueAsUInt());
    }
    return 0;
}